

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::InstallSymlink(cmFileCopier *this,string *fromFile,string *toFile)

{
  cmCommand *pcVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  string local_3d0;
  undefined1 local_3b0 [8];
  ostringstream e_1;
  string local_238;
  undefined1 local_218 [8];
  string oldSymlinkTarget;
  undefined1 local_1f0 [3];
  bool copy;
  undefined1 local_1d0 [8];
  ostringstream e;
  undefined1 local_48 [8];
  string symlinkTarget;
  string *toFile_local;
  string *fromFile_local;
  cmFileCopier *this_local;
  
  symlinkTarget.field_2._8_8_ = toFile;
  std::__cxx11::string::string((string *)local_48);
  bVar2 = cmsys::SystemTools::ReadSymlink(fromFile,(string *)local_48);
  if (bVar2) {
    oldSymlinkTarget.field_2._M_local_buf[0xb] = '\x01';
    if ((this->Always & 1U) == 0) {
      std::__cxx11::string::string((string *)local_218);
      bVar2 = cmsys::SystemTools::ReadSymlink
                        ((string *)symlinkTarget.field_2._8_8_,(string *)local_218);
      if ((bVar2) &&
         (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_218), _Var3)) {
        oldSymlinkTarget.field_2._M_local_buf[0xb] = '\0';
      }
      std::__cxx11::string::~string((string *)local_218);
    }
    (*this->_vptr_cmFileCopier[4])
              (this,symlinkTarget.field_2._8_8_,2,
               (ulong)((byte)oldSymlinkTarget.field_2._M_local_buf[0xb] & 1));
    if ((oldSymlinkTarget.field_2._M_local_buf[0xb] & 1U) != 0) {
      cmsys::SystemTools::RemoveFile((string *)symlinkTarget.field_2._8_8_);
      cmsys::SystemTools::GetFilenamePath(&local_238,(string *)symlinkTarget.field_2._8_8_);
      cmsys::SystemTools::MakeDirectory(&local_238,(mode_t *)0x0);
      std::__cxx11::string::~string((string *)&local_238);
      bVar2 = cmSystemTools::CreateSymlink
                        ((string *)local_48,(string *)symlinkTarget.field_2._8_8_,(string *)0x0);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        poVar4 = std::operator<<((ostream *)local_3b0,this->Name);
        poVar4 = std::operator<<(poVar4," cannot duplicate symlink \"");
        poVar4 = std::operator<<(poVar4,(string *)fromFile);
        poVar4 = std::operator<<(poVar4,"\" at \"");
        poVar4 = std::operator<<(poVar4,(string *)symlinkTarget.field_2._8_8_);
        std::operator<<(poVar4,"\".");
        pcVar1 = &this->FileCommand->super_cmCommand;
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(pcVar1,&local_3d0);
        std::__cxx11::string::~string((string *)&local_3d0);
        this_local._7_1_ = false;
        oldSymlinkTarget.field_2._12_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        goto LAB_003e3714;
      }
    }
    this_local._7_1_ = true;
    oldSymlinkTarget.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    poVar4 = std::operator<<((ostream *)local_1d0,this->Name);
    poVar4 = std::operator<<(poVar4," cannot read symlink \"");
    poVar4 = std::operator<<(poVar4,(string *)fromFile);
    poVar4 = std::operator<<(poVar4,"\" to duplicate at \"");
    poVar4 = std::operator<<(poVar4,(string *)symlinkTarget.field_2._8_8_);
    std::operator<<(poVar4,"\".");
    pcVar1 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(pcVar1,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    this_local._7_1_ = false;
    oldSymlinkTarget.field_2._12_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  }
LAB_003e3714:
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmFileCopier::InstallSymlink(const std::string& fromFile,
                                  const std::string& toFile)
{
  // Read the original symlink.
  std::string symlinkTarget;
  if (!cmSystemTools::ReadSymlink(fromFile, symlinkTarget)) {
    std::ostringstream e;
    e << this->Name << " cannot read symlink \"" << fromFile
      << "\" to duplicate at \"" << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Compare the symlink value to that at the destination if not
  // always installing.
  bool copy = true;
  if (!this->Always) {
    std::string oldSymlinkTarget;
    if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
      if (symlinkTarget == oldSymlinkTarget) {
        copy = false;
      }
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeLink, copy);

  if (copy) {
    // Remove the destination file so we can always create the symlink.
    cmSystemTools::RemoveFile(toFile);

    // Create destination directory if it doesn't exist
    cmSystemTools::MakeDirectory(cmSystemTools::GetFilenamePath(toFile));

    // Create the symlink.
    if (!cmSystemTools::CreateSymlink(symlinkTarget, toFile)) {
      std::ostringstream e;
      e << this->Name << " cannot duplicate symlink \"" << fromFile
        << "\" at \"" << toFile << "\".";
      this->FileCommand->SetError(e.str());
      return false;
    }
  }

  return true;
}